

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

Expression * __thiscall slang::ast::ClassType::getBaseConstructorCall(ClassType *this)

{
  Scope *this_00;
  StatementKind SVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  Type *this_01;
  Symbol *pSVar4;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  SubroutineSymbol *this_02;
  Statement *pSVar5;
  Diagnostic *pDVar6;
  SourceLocation SVar7;
  SourceLocation argSyntax;
  Expression *pEVar8;
  ulong uVar9;
  Expression *pEVar10;
  Diagnostic *this_03;
  long lVar11;
  SourceLocation context;
  ushort uVar12;
  long lVar13;
  DiagCode noteCode;
  SyntaxNode *pSVar14;
  SourceRange SVar15;
  ASTContext local_d0;
  _Storage<slang::SourceRange,_true> local_98;
  undefined1 local_88;
  undefined7 uStack_87;
  _Storage<slang::SourceRange,_true> local_80;
  undefined1 local_70;
  undefined7 uStack_6f;
  TokenKind local_68;
  undefined1 uStack_66;
  NumericTokenFlags NStack_65;
  uint32_t uStack_64;
  Info *local_60;
  undefined1 local_38;
  
  if ((this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged == true) {
    return (this->baseConstructorCall).
           super__Optional_base<const_slang::ast::Expression_*,_true,_true>._M_payload.
           super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value;
  }
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
       (Expression *)0x0;
  (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
  pSVar3 = (this->super_Type).super_Symbol.originatingSyntax;
  if (*(long *)(pSVar3 + 6) == 0) {
    return (Expression *)0x0;
  }
  this_00 = &this->super_Scope;
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(this_00);
  }
  this_01 = this->baseClass;
  if (this_01->canonical == (Type *)0x0) {
    Type::resolveCanonical(this_01);
  }
  if ((this_01->canonical->super_Symbol).kind == ErrorType) {
    return (Expression *)0x0;
  }
  this_02 = getConstructor(this);
  if (this_02 == (SubroutineSymbol *)0x0) {
    uVar12 = 0;
    pEVar8 = (Expression *)0x0;
  }
  else {
    uVar12 = (this_02->flags).m_bits;
    pSVar5 = SubroutineSymbol::getBody(this_02);
    SVar1 = pSVar5->kind;
    if (SVar1 == Invalid) {
      return (Expression *)0x0;
    }
    uVar12 = uVar12 >> 0xc;
    if (SVar1 == List) {
      if (pSVar5[1].syntax == (StatementSyntax *)0x0) {
LAB_00236a4c:
        pEVar8 = (Expression *)0x0;
      }
      else {
        lVar11 = 0;
        do {
          iVar2 = **(int **)(*(long *)(pSVar5 + 1) + lVar11);
          if (iVar2 != 5) {
            pEVar8 = (Expression *)0x0;
            if (iVar2 == 4) {
              pEVar10 = *(Expression **)(*(int **)(*(long *)(pSVar5 + 1) + lVar11) + 8);
              goto LAB_00236a03;
            }
            break;
          }
          lVar11 = lVar11 + 8;
          pEVar8 = (Expression *)0x0;
        } while ((long)pSVar5[1].syntax << 3 != lVar11);
      }
    }
    else {
      pEVar8 = (Expression *)0x0;
      if (SVar1 == ExpressionStatement) {
        pEVar10 = *(Expression **)(pSVar5 + 1);
LAB_00236a03:
        if (pEVar10->kind != NewClass) goto LAB_00236a4c;
        pEVar8 = (Expression *)0x0;
        if ((char)pEVar10[1].kind != Invalid) {
          pEVar8 = pEVar10;
        }
      }
    }
  }
  local_d0.lookupIndex = this->headerIndex;
  local_d0.flags.m_bits = 0;
  local_d0.instanceOrProc = (Symbol *)0x0;
  local_d0.firstTempVar = (TempVarSymbol *)0x0;
  local_d0.randomizeDetails = (RandomizeDetails *)0x0;
  local_d0.assertionInstance = (AssertionInstanceDetails *)0x0;
  pSVar3 = *(SyntaxNode **)(pSVar3 + 6);
  local_d0.scope.ptr = this_00;
  if (pEVar8 == (Expression *)0x0) {
LAB_00236af9:
    pEVar10 = *(Expression **)(pSVar3 + 2);
    if (pEVar10 == (Expression *)0x0) {
      if (pSVar3[2].parent != (SyntaxNode *)0x0) {
        if ((uVar12 & 1) == 0) {
          pDVar6 = ASTContext::addDiag(&local_d0,(DiagCode)0x640007,(this_02->super_Symbol).location
                                      );
          SVar15 = slang::syntax::SyntaxNode::sourceRange(pSVar3[2].parent);
          Diagnostic::addNote(pDVar6,(DiagCode)0xc0001,SVar15);
        }
        uVar12 = 1;
      }
    }
    else if (this->baseConstructor == (Symbol *)0x0) {
      if (pEVar10[1].sourceRange.endLoc != (SourceLocation)0x0) {
        SVar15 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pEVar10);
        pDVar6 = ASTContext::addDiag(&local_d0,(DiagCode)0xa00007,SVar15);
        Diagnostic::operator<<(pDVar6,(this->baseClass->super_Symbol).name);
        _local_68 = (Segment *)0x0;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<long>(&pDVar6->args,(long *)&stack0xffffffffffffff98);
        uVar9 = (long)pEVar10[1].sourceRange.endLoc + 1U >> 1;
        local_68 = (short)uVar9;
        uStack_66 = (char)(uVar9 >> 0x10);
        NStack_65.raw = (char)(uVar9 >> 0x18);
        uStack_64 = (int)(uVar9 >> 0x20);
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)&stack0xffffffffffffff98);
      }
    }
    else {
      local_80._M_value = slang::syntax::SyntaxNode::sourceRange(pSVar3);
      context = local_80._M_value.endLoc;
      argSyntax = local_80._M_value.startLoc;
      local_70 = 1;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_6f;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_80._M_value;
      SVar7 = context;
      Lookup::ensureVisible(this->baseConstructor,&local_d0,sourceRange);
      _local_68 = (Segment *)this->baseConstructor;
      local_38 = 0;
      SVar15.endLoc = SVar7;
      SVar15.startLoc = (SourceLocation)&local_d0;
      pEVar8 = CallExpression::fromArgs
                         ((CallExpression *)(local_d0.scope.ptr)->compilation,
                          (Compilation *)&stack0xffffffffffffff98,(Subroutine *)0x0,pEVar10,
                          (ArgumentListSyntax *)argSyntax,SVar15,(ASTContext *)context);
    }
    pSVar4 = this->baseConstructor;
    if ((pEVar8 == (Expression *)0x0 && pSVar4 != (Symbol *)0x0) && ((uVar12 & 1) == 0)) {
      if (*(int *)&pSVar4[1].nextInScope != 0) {
        Scope::elaborate((Scope *)(pSVar4 + 1));
      }
      lVar11 = *(long *)(pSVar4 + 4);
      if (lVar11 != 0) {
        pSVar14 = pSVar4[3].originatingSyntax;
        lVar13 = 0;
        do {
          pEVar10 = FormalArgumentSymbol::getDefaultValue
                              (*(FormalArgumentSymbol **)((long)&pSVar14->kind + lVar13));
          if (pEVar10 == (Expression *)0x0) {
            SVar15 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
            pDVar6 = ASTContext::addDiag(&local_d0,(DiagCode)0x80006,SVar15);
            this_03 = Diagnostic::operator<<(pDVar6,(this->super_Type).super_Symbol.name);
            Diagnostic::operator<<(this_03,(this->baseClass->super_Symbol).name);
            SVar7 = this->baseConstructor->location;
            noteCode.subsystem = General;
            noteCode.code = 5;
            goto LAB_00236aca;
          }
          lVar13 = lVar13 + 8;
        } while (lVar11 << 3 != lVar13);
      }
      pSVar4 = this->baseConstructor;
      local_98._M_value = slang::syntax::SyntaxNode::sourceRange(pSVar3);
      local_88 = 1;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_87;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = local_98._M_value;
      Lookup::ensureVisible(pSVar4,&local_d0,sourceRange_00);
    }
    (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_payload._M_value =
         pEVar8;
    (this->baseConstructorCall).super__Optional_base<const_slang::ast::Expression_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Expression_*>._M_engaged = true;
    return pEVar8;
  }
  pSVar14 = *(SyntaxNode **)(pSVar3 + 2);
  if (pSVar14 == (SyntaxNode *)0x0) {
    if (pSVar3[2].parent == (SyntaxNode *)0x0) goto LAB_00236af9;
    pSVar14 = pSVar3[2].parent;
  }
  pDVar6 = ASTContext::addDiag(&local_d0,(DiagCode)0x70006,pEVar8->sourceRange);
  _local_68 = slang::syntax::SyntaxNode::getFirstToken(pSVar14);
  SVar7 = parsing::Token::location((Token *)&stack0xffffffffffffff98);
  noteCode.subsystem = General;
  noteCode.code = 0xc;
LAB_00236aca:
  Diagnostic::addNote(pDVar6,noteCode,SVar7);
  return (Expression *)0x0;
}

Assistant:

const Expression* ClassType::getBaseConstructorCall() const {
    if (baseConstructorCall)
        return *baseConstructorCall;

    baseConstructorCall = nullptr;
    const Expression* callExpr = nullptr;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto& classSyntax = syntax->as<ClassDeclarationSyntax>();
    if (!classSyntax.extendsClause)
        return nullptr;

    ensureElaborated();

    SLANG_ASSERT(baseClass);
    if (baseClass->isError())
        return nullptr;

    // If we have a constructor, find whether it invokes super.new in its body.
    bool constructorHasDefault = false;
    auto ourConstructor = getConstructor();
    if (ourConstructor) {
        auto checkForSuperNew = [&](const Statement& stmt) {
            if (stmt.kind == StatementKind::ExpressionStatement) {
                auto& expr = stmt.as<ExpressionStatement>().expr;
                if (expr.kind == ExpressionKind::NewClass &&
                    expr.as<NewClassExpression>().isSuperClass) {
                    callExpr = &expr;
                }
            }
        };

        // If the body is invalid, early out now so we don't report
        // spurious errors on top of it.
        constructorHasDefault = ourConstructor->flags.has(MethodFlags::DefaultedSuperArg);
        auto& body = ourConstructor->getBody();
        if (body.bad())
            return nullptr;

        if (body.kind != StatementKind::List) {
            checkForSuperNew(body);
        }
        else {
            for (auto stmt : body.as<StatementList>().list) {
                if (stmt->kind != StatementKind::VariableDeclaration) {
                    checkForSuperNew(*stmt);
                    break;
                }
            }
        }
    }

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));
    auto& extendsClause = *classSyntax.extendsClause;

    // Can't have both a super.new and extends arguments.
    if (callExpr && (extendsClause.arguments || extendsClause.defaultedArg)) {
        auto argSyntax = extendsClause.arguments ? (const SyntaxNode*)extendsClause.arguments
                                                 : extendsClause.defaultedArg;
        auto& diag = context.addDiag(diag::BaseConstructorDuplicate, callExpr->sourceRange);
        diag.addNote(diag::NotePreviousUsage, argSyntax->getFirstToken().location());
        return nullptr;
    }

    if (auto extendsArgs = extendsClause.arguments) {
        // If we have a base class constructor, create the call to it.
        if (baseConstructor) {
            SourceRange range = extendsClause.sourceRange();
            Lookup::ensureVisible(*baseConstructor, context, range);

            callExpr = &CallExpression::fromArgs(context.getCompilation(),
                                                 &baseConstructor->as<SubroutineSymbol>(), nullptr,
                                                 extendsArgs, range, context);
        }
        else if (!extendsArgs->parameters.empty()) {
            auto& diag = context.addDiag(diag::TooManyArguments, extendsArgs->sourceRange());
            diag << baseClass->name;
            diag << 0;
            diag << extendsArgs->parameters.size();
        }
    }
    else if (extendsClause.defaultedArg) {
        SLANG_ASSERT(ourConstructor);
        if (!constructorHasDefault) {
            auto& diag = context.addDiag(diag::InvalidExtendsDefault, ourConstructor->location);
            diag.addNote(diag::NotePreviousUsage, extendsClause.defaultedArg->sourceRange());
        }

        constructorHasDefault = true;
    }

    // If we have a base class constructor and nothing called it, make sure
    // it has no arguments or all of the arguments have default values.
    // If our own constructor declares a 'default' arg then this requirement
    // is removed since we will insert the appropriate call arguments automatically.
    if (baseConstructor && !callExpr && !constructorHasDefault) {
        for (auto arg : baseConstructor->as<SubroutineSymbol>().getArguments()) {
            if (!arg->getDefaultValue()) {
                auto& diag = context.addDiag(diag::BaseConstructorNotCalled,
                                             extendsClause.sourceRange());
                diag << name << baseClass->name;
                diag.addNote(diag::NoteDeclarationHere, baseConstructor->location);
                return nullptr;
            }
        }

        Lookup::ensureVisible(*baseConstructor, context, extendsClause.sourceRange());
    }

    baseConstructorCall = callExpr;
    return callExpr;
}